

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

void __thiscall
Oric::VIAPortHandler::VIAPortHandler
          (VIAPortHandler *this,AsyncTaskQueue<false,_true,_void> *audio_queue,AY *ay8910,
          Speaker *speaker,TapePlayer *tape_player,Keyboard *keyboard)

{
  Joystick *pJVar1;
  Joystick *local_20;
  
  (this->super_IRQDelegatePortHandler).delegate_ = (Delegate *)0x0;
  this->ay_bdir_ = false;
  this->ay_bc1_ = false;
  this->porta_output_ = 0xff;
  (this->cycles_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->audio_queue_ = audio_queue;
  this->ay8910_ = ay8910;
  this->speaker_ = speaker;
  this->tape_player_ = tape_player;
  this->keyboard_ = keyboard;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pJVar1 = (Joystick *)operator_new(0x48);
  anon_unknown.dwarf_dab7fb::Joystick::Joystick(pJVar1);
  local_20 = pJVar1;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<(anonymous_namespace)::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_20);
  pJVar1 = (Joystick *)operator_new(0x48);
  anon_unknown.dwarf_dab7fb::Joystick::Joystick(pJVar1);
  local_20 = pJVar1;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<(anonymous_namespace)::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_20);
  return;
}

Assistant:

VIAPortHandler(Concurrency::AsyncTaskQueue<false> &audio_queue, AY &ay8910, Speaker &speaker, TapePlayer &tape_player, Keyboard &keyboard) :
			audio_queue_(audio_queue), ay8910_(ay8910), speaker_(speaker), tape_player_(tape_player), keyboard_(keyboard)
		{
			// Attach a couple of joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);
		}